

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_Mul_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::ECCurveTest_Mul_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x20);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_006fe9c0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__ECCurveTest_Mul_Test_006fea00;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }